

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.hpp
# Opt level: O1

void __thiscall
lightconf::group::set<std::__cxx11::string>
          (group *this,path *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  pointer pcVar1;
  value *pvVar2;
  group *parent_group_const;
  path key_rest;
  group *local_e0;
  path local_d8;
  undefined1 local_c0 [16];
  _Alloc_hider local_b0;
  char local_a0 [16];
  bool local_90;
  vector<lightconf::value,_std::allocator<lightconf::value>_> local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
  _Stack_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_40;
  
  local_d8.parts_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_d8.parts_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_d8.parts_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = find_value<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                     (this,(key->parts_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                      (key->parts_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,&local_e0,&local_d8);
  if (pvVar2 == (value *)0x0) {
    create_value<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
              (local_e0,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )local_d8.parts_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_d8.parts_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,val);
  }
  else {
    local_c0._0_4_ = string_type;
    pcVar1 = (val->_M_dataplus)._M_p;
    local_b0._M_p = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + val->_M_string_length);
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left =
         &_Stack_70._M_impl.super__Rb_tree_header._M_header;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _Stack_70._M_impl._0_8_ = 0;
    local_88.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _Stack_70._M_impl.super__Rb_tree_header._M_node_count = 0;
    vStack_40.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_40.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_40.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _Stack_70._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_70._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((value *)local_c0 != pvVar2) {
      pvVar2->number_value_ = (double)local_c0._8_8_;
      std::__cxx11::string::_M_assign((string *)&pvVar2->string_value_);
      pvVar2->bool_value_ = local_90;
      std::vector<lightconf::value,_std::allocator<lightconf::value>_>::operator=
                (&pvVar2->vector_value_,&local_88);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
      ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
                   *)&pvVar2->group_value_,&_Stack_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(pvVar2->group_value_).order_,&vStack_40);
      pvVar2->type_ = local_c0._0_4_;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_40);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
    ::~_Rb_tree(&_Stack_70);
    std::vector<lightconf::value,_std::allocator<lightconf::value>_>::~vector(&local_88);
    if (local_b0._M_p != local_a0) {
      operator_delete(local_b0._M_p);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8.parts_);
  return;
}

Assistant:

inline void group::set(const path& key, const T& val) {
    const value *result_const;
    const group *parent_group_const;
    group *parent_group;
    value *result;
    path key_rest;

    result_const = find_value(std::begin(key), std::end(key), &parent_group_const, &key_rest);

    parent_group = const_cast<group *>(parent_group_const);
    result = const_cast<value *>(result_const);

    if (result) {
        *result = value_type_info<T>::create_value(val);
    } else {
        parent_group->create_value(std::begin(key_rest), std::end(key_rest), val);
    }
}